

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

void __thiscall Pl_AES_PDF::setIV(Pl_AES_PDF *this,uchar *iv,size_t bytes)

{
  logic_error *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  unsigned_long local_20;
  size_t bytes_local;
  uchar *iv_local;
  Pl_AES_PDF *this_local;
  
  local_20 = bytes;
  bytes_local = (size_t)iv;
  iv_local = (uchar *)this;
  if (bytes != 0x10) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_60,local_20);
    std::operator+(&local_40,"Pl_AES_PDF: specified initialization vector size in bytes must be ",
                   &local_60);
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->use_specified_iv = true;
  memcpy(this->specified_iv,iv,0x10);
  return;
}

Assistant:

void
Pl_AES_PDF::setIV(unsigned char const* iv, size_t bytes)
{
    if (bytes != this->buf_size) {
        throw std::logic_error(
            "Pl_AES_PDF: specified initialization vector"
            " size in bytes must be " +
            std::to_string(bytes));
    }
    this->use_specified_iv = true;
    memcpy(this->specified_iv, iv, bytes);
}